

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O1

char * __thiscall Options::match_longopt(Options *this,char *opt,int len,int *ambiguous)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  char **optv;
  char **ppcVar6;
  char cVar7;
  int __c;
  int __c_00;
  char *pcVar8;
  ulong uVar9;
  bool bVar10;
  char *local_60;
  char *local_48;
  
  *ambiguous = 0;
  ppcVar6 = this->optvec;
  if (((ppcVar6 == (char **)0x0) || (*ppcVar6 == (char *)0x0)) ||
     (pcVar4 = *ppcVar6, pcVar4 == (char *)0x0)) {
    local_60 = (char *)0x0;
  }
  else {
    local_60 = (char *)0x0;
    do {
      cVar1 = *pcVar4;
      uVar5 = (ulong)(cVar1 == '-');
      if ((pcVar4[uVar5 + 1] == '\0') || (pcVar4[uVar5 + 2] == '\0')) {
        pcVar8 = (char *)0x0;
      }
      else {
        iVar3 = isspace((int)pcVar4[uVar5 + 2]);
        pcVar8 = pcVar4 + uVar5 + 2;
        if (iVar3 != 0) {
          pcVar8 = (char *)0x0;
        }
      }
      if (pcVar8 == (char *)0x0) {
        bVar10 = false;
      }
      else {
        bVar10 = pcVar8 == opt;
        if (opt == (char *)0x0 || bVar10) {
LAB_001e81cd:
          cVar7 = bVar10 * '\x02';
        }
        else {
          if (*pcVar8 == '\0') {
            bVar10 = *opt == '\0';
            goto LAB_001e81cd;
          }
          cVar7 = '\0';
          if (*opt != '\0') {
            if (len < 0) {
              uVar9 = 0;
            }
            else {
              uVar9 = 0;
              do {
                bVar2 = opt[uVar9];
                if ((bVar2 & 0xdf) == 0) break;
                __c = (int)pcVar8[uVar9];
                iVar3 = isupper(__c);
                if (iVar3 != 0) {
                  __c = tolower(__c);
                }
                __c_00 = (int)(char)bVar2;
                iVar3 = isupper(__c_00);
                if (iVar3 != 0) {
                  __c_00 = tolower(__c_00);
                }
                if (__c != __c_00) goto LAB_001e81cf;
                uVar9 = uVar9 + 1;
              } while ((int)uVar9 < len || len == 0);
              uVar9 = uVar9 & 0xffffffff;
            }
            cVar7 = (pcVar8[uVar9] == '\0') + '\x01';
          }
        }
LAB_001e81cf:
        bVar10 = false;
        if (cVar7 == '\x01') {
          if (local_60 == (char *)0x0) {
            local_60 = pcVar4 + (uVar5 - (cVar1 == '-'));
          }
          else {
            *ambiguous = *ambiguous + 1;
            bVar10 = true;
            local_48 = (char *)0x0;
          }
        }
        else if (cVar7 == '\x02') {
          local_48 = pcVar4 + (uVar5 - (cVar1 == '-'));
          bVar10 = true;
        }
      }
      if (bVar10) {
        return local_48;
      }
      pcVar4 = ppcVar6[1];
      ppcVar6 = ppcVar6 + 1;
    } while (pcVar4 != (char *)0x0);
  }
  return local_60;
}

Assistant:

const char *
Options::match_longopt(const char * opt, int  len, int & ambiguous) const {
   kwdmatch_t  result;
   const char * matched = NULLSTR ;

   ambiguous = 0;
   if ((optvec == NULL) || (! *optvec))  return  NULLSTR;

   for (const char * const * optv = optvec ; *optv ; optv++) {
      OptionSpec  optspec = *optv;
      const char * longopt = optspec.LongOpt();
      if (longopt == NULL)  continue;
      result = kwdmatch(longopt, opt, len);
      if (result == EXACT_MATCH) {
         return  optspec;
      } else if (result == PARTIAL_MATCH) {
         if (matched) {
            ++ambiguous;
            return  NULLSTR;
         } else {
            matched = optspec;
         }
      }
   }//for

   return  matched;
}